

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O3

void __thiscall
nuraft::stat_mgr::get_all_stats
          (stat_mgr *this,
          vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_> *stats_out)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->stat_map_lock_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  std::vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_>::resize
            (stats_out,(this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = (this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->stat_map_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    lVar3 = 0;
    do {
      *(undefined8 *)(*(long *)stats_out + lVar3) = *(undefined8 *)(p_Var1 + 2);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      lVar3 = lVar3 + 8;
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void stat_mgr::get_all_stats(std::vector<stat_elem*>& stats_out) {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    stats_out.resize(stat_map_.size());
    size_t idx = 0;
    for (auto& entry: stat_map_) {
        stats_out[idx++] = entry.second;
    }
}